

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  uint32_t uVar3;
  TokenType TVar4;
  uint64_t uVar5;
  pointer pcVar6;
  size_type sVar7;
  ushort *puVar8;
  long lVar9;
  double dVar10;
  bool bVar11;
  __type _Var12;
  bool bVar13;
  uint32_t uVar14;
  int32_t iVar15;
  int iVar16;
  EnumDescriptor *this_00;
  EnumValueDescriptor *value_00;
  uint64_t uVar17;
  int64_t iVar18;
  EnumValueDescriptor *pEVar19;
  EnumValueDescriptor *pEVar20;
  AlphaNum *a;
  byte bVar21;
  string *psVar22;
  float fVar23;
  float fVar24;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view name;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  int64_t int_value;
  string value_9;
  int64_t value;
  FieldDescriptor *local_168;
  string value_4;
  AlphaNum local_120;
  string local_f0;
  string local_d0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar11 = ConsumeSignedInteger(this,&value,0x7fffffff);
    if (!bVar11) {
LAB_003ac885:
      bVar21 = 0;
      goto LAB_003ac887;
    }
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddInt32(reflection,message,field,(uint32_t)value);
    }
    else if ((((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
              (bVar11 = FieldDescriptor::has_presence(field), bVar11)) ||
             (iVar16 = (field->field_20).default_value_int32_t_,
             iVar15 = Reflection::GetInt32(reflection,message,field), iVar16 != iVar15)) ||
            ((field->field_20).default_value_int32_t_ != (uint32_t)value)) {
      Reflection::SetInt32(reflection,message,field,(uint32_t)value);
    }
    else {
LAB_003ac35f:
      local_120.piece_._M_len = (size_t)message;
      local_120.piece_._M_str = (char *)field;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::
      emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                  *)&value_9,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                  *)this->no_op_fields_,
                 (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                  *)&local_120);
    }
    break;
  case 2:
    bVar11 = ConsumeSignedInteger(this,&value,0x7fffffffffffffff);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddInt64(reflection,message,field,value);
    }
    else {
      if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
          (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) &&
         ((lVar9 = (field->field_20).default_value_int64_t_,
          iVar18 = Reflection::GetInt64(reflection,message,field), lVar9 == iVar18 &&
          ((field->field_20).default_value_int64_t_ == value)))) goto LAB_003ac35f;
      Reflection::SetInt64(reflection,message,field,value);
    }
    break;
  case 3:
    bVar11 = ConsumeUnsignedInteger(this,(uint64_t *)&value,0xffffffff);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddUInt32(reflection,message,field,(uint32_t)value);
    }
    else {
      if (((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
          (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) &&
         ((uVar3 = (field->field_20).default_value_int32_t_,
          uVar14 = Reflection::GetUInt32(reflection,message,field), uVar3 == uVar14 &&
          ((field->field_20).default_value_int32_t_ == (uint32_t)value)))) goto LAB_003ac35f;
      Reflection::SetUInt32(reflection,message,field,(uint32_t)value);
    }
    break;
  case 4:
    bVar11 = ConsumeUnsignedInteger(this,(uint64_t *)&value,0xffffffffffffffff);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddUInt64(reflection,message,field,value);
    }
    else {
      if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) &&
          (uVar5 = (field->field_20).default_value_int64_t_,
          uVar17 = Reflection::GetUInt64(reflection,message,field), uVar5 == uVar17)) &&
         ((field->field_20).default_value_int64_t_ == value)) goto LAB_003ac35f;
      Reflection::SetUInt64(reflection,message,field,value);
    }
    break;
  case 5:
    bVar11 = ConsumeDouble(this,(double *)&value);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddDouble(reflection,message,field,(double)value);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) {
        dVar2 = (field->field_20).default_value_double_;
        dVar10 = Reflection::GetDouble(reflection,message,field);
        if ((dVar2 == dVar10) && (!NAN(dVar2) && !NAN(dVar10))) {
          if (((field->field_20).default_value_double_ == (double)value) &&
             (!NAN((field->field_20).default_value_double_) && !NAN((double)value)))
          goto LAB_003ac35f;
        }
      }
      Reflection::SetDouble(reflection,message,field,(double)value);
    }
    break;
  case 6:
    bVar11 = ConsumeDouble(this,(double *)&value);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      fVar23 = io::SafeDoubleToFloat((double)value);
      Reflection::AddFloat(reflection,message,field,fVar23);
    }
    else {
      if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
         (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) {
        fVar23 = (field->field_20).default_value_float_;
        fVar24 = Reflection::GetFloat(reflection,message,field);
        if ((fVar23 == fVar24) && (!NAN(fVar23) && !NAN(fVar24))) {
          fVar23 = (field->field_20).default_value_float_;
          fVar24 = io::SafeDoubleToFloat((double)value);
          if ((fVar23 == fVar24) && (!NAN(fVar23) && !NAN(fVar24))) goto LAB_003ac35f;
        }
      }
      fVar23 = io::SafeDoubleToFloat((double)value);
      Reflection::SetFloat(reflection,message,field,fVar23);
    }
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      value_4._M_dataplus._M_p = (pointer)&value_4.field_2;
      value_4._M_string_length = 0;
      value_4.field_2._M_local_buf[0] = '\0';
      bVar11 = ConsumeIdentifier(this,&value_4);
      if (!bVar11) {
LAB_003ac87b:
        psVar22 = &value_4;
        goto LAB_003ac880;
      }
      bVar11 = std::operator==(&value_4,"true");
      if (((bVar11) || (bVar11 = std::operator==(&value_4,"True"), bVar11)) ||
         (bVar11 = std::operator==(&value_4,"t"), bVar11)) {
        bVar11 = FieldDescriptor::is_repeated(field);
        bVar13 = true;
        if (bVar11) {
LAB_003abdc3:
          Reflection::AddBool(reflection,message,field,bVar13);
        }
        else if ((((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
                  (bVar11 = FieldDescriptor::has_presence(field), bVar11)) ||
                 (bVar11 = (field->field_20).default_value_bool_,
                 bVar13 = Reflection::GetBool(reflection,message,field), bVar13 != bVar11)) ||
                ((field->field_20).default_value_bool_ != true)) {
          Reflection::SetBool(reflection,message,field,true);
        }
        else {
          local_120.piece_._M_len = (size_t)message;
          local_120.piece_._M_str = (char *)field;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::
          emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                      *)&value_9,
                     (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this->no_op_fields_,
                     (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                      *)&local_120);
        }
      }
      else {
        bVar11 = std::operator==(&value_4,"false");
        if (((!bVar11) && (bVar11 = std::operator==(&value_4,"False"), !bVar11)) &&
           (bVar11 = std::operator==(&value_4,"f"), !bVar11)) {
          value_9._0_16_ =
               absl::lts_20250127::NullSafeStringView("Invalid value for boolean field \"");
          puVar8 = (ushort *)(field->all_names_).payload_;
          local_120.piece_._M_len = (size_t)*puVar8;
          local_120.piece_._M_str = (char *)((long)puVar8 + ~local_120.piece_._M_len);
          _value = absl::lts_20250127::NullSafeStringView("\". Value: \"");
          local_60.piece_._M_len = value_4._M_string_length;
          local_60.piece_._M_str = value_4._M_dataplus._M_p;
          local_90.piece_ = absl::lts_20250127::NullSafeStringView("\".");
          absl::lts_20250127::StrCat<>
                    (&local_f0,(AlphaNum *)&value_9,&local_120,(AlphaNum *)&value,&local_60,
                     &local_90);
          message_03._M_str = local_f0._M_dataplus._M_p;
          message_03._M_len = local_f0._M_string_length;
          ReportError(this,message_03);
          std::__cxx11::string::~string((string *)&local_f0);
          goto LAB_003ac87b;
        }
        bVar11 = FieldDescriptor::is_repeated(field);
        if (bVar11) {
          bVar13 = false;
          goto LAB_003abdc3;
        }
        if (((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
            (bVar11 = FieldDescriptor::has_presence(field), bVar11)) ||
           ((bVar11 = (field->field_20).default_value_bool_,
            bVar13 = Reflection::GetBool(reflection,message,field), bVar13 != bVar11 ||
            ((field->field_20).default_value_bool_ != false)))) {
          Reflection::SetBool(reflection,message,field,false);
        }
        else {
          local_120.piece_._M_len = (size_t)message;
          local_120.piece_._M_str = (char *)field;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::
          emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                      *)&value_9,
                     (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                      *)this->no_op_fields_,
                     (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                      *)&local_120);
        }
      }
      psVar22 = &value_4;
      goto LAB_003ac665;
    }
    bVar11 = ConsumeUnsignedInteger(this,(uint64_t *)&value,1);
    if (!bVar11) goto LAB_003ac885;
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      Reflection::AddBool(reflection,message,field,value != 0);
    }
    else {
      if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
           (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) &&
          (bVar11 = (field->field_20).default_value_bool_,
          bVar13 = Reflection::GetBool(reflection,message,field), bVar13 == bVar11)) &&
         ((value == 0) != (field->field_20).default_value_bool_)) goto LAB_003ac35f;
      Reflection::SetBool(reflection,message,field,value != 0);
    }
    break;
  case 8:
    value_4._M_dataplus._M_p = (pointer)&value_4.field_2;
    value_4._M_string_length = 0;
    value_4.field_2._M_local_buf[0] = '\0';
    int_value = 0x7fffffffffffffff;
    this_00 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar11 = ConsumeIdentifier(this,&value_4);
      if (!bVar11) goto LAB_003ac59c;
      name._M_str = value_4._M_dataplus._M_p;
      name._M_len = value_4._M_string_length;
      value_00 = EnumDescriptor::FindValueByName(this_00,name);
LAB_003ac0d6:
      if (value_00 == (EnumValueDescriptor *)0x0) {
        if ((int_value == 0x7fffffffffffffff) ||
           (bVar11 = FieldDescriptor::legacy_enum_field_treated_as_closed(field), bVar11)) {
          if (this->allow_unknown_enum_ == false) {
            value_9._0_16_ =
                 absl::lts_20250127::NullSafeStringView("Unknown enumeration value of \"");
            local_120.piece_._M_len = value_4._M_string_length;
            local_120.piece_._M_str = value_4._M_dataplus._M_p;
            _value = absl::lts_20250127::NullSafeStringView("\" for field \"");
            puVar8 = (ushort *)(field->all_names_).payload_;
            local_60.piece_._M_len = (size_t)*puVar8;
            local_60.piece_._M_str = (char *)((long)puVar8 + ~local_60.piece_._M_len);
            local_90.piece_ = absl::lts_20250127::NullSafeStringView("\".");
            absl::lts_20250127::StrCat<>
                      (&local_f0,(AlphaNum *)&value_9,&local_120,(AlphaNum *)&value,&local_60,
                       &local_90);
            message_02._M_str = local_f0._M_dataplus._M_p;
            message_02._M_len = local_f0._M_string_length;
            ReportError(this,message_02);
            psVar22 = &local_f0;
            goto LAB_003ac597;
          }
          value_9._0_16_ = absl::lts_20250127::NullSafeStringView("Unknown enumeration value of \"")
          ;
          local_120.piece_._M_len = value_4._M_string_length;
          local_120.piece_._M_str = value_4._M_dataplus._M_p;
          _value = absl::lts_20250127::NullSafeStringView("\" for field \"");
          puVar8 = (ushort *)(field->all_names_).payload_;
          local_60.piece_._M_len = (size_t)*puVar8;
          local_60.piece_._M_str = (char *)((long)puVar8 + ~local_60.piece_._M_len);
          local_90.piece_ = absl::lts_20250127::NullSafeStringView("\".");
          absl::lts_20250127::StrCat<>
                    (&local_f0,(AlphaNum *)&value_9,&local_120,(AlphaNum *)&value,&local_60,
                     &local_90);
          message_00._M_str = local_f0._M_dataplus._M_p;
          message_00._M_len = local_f0._M_string_length;
          ReportWarning(this,message_00);
          std::__cxx11::string::~string((string *)&local_f0);
LAB_003ac2b1:
          bVar11 = true;
          field = (FieldDescriptor *)0x1;
        }
        else {
          bVar11 = FieldDescriptor::is_repeated(field);
          if (bVar11) {
            bVar11 = true;
            Reflection::AddEnumValue(reflection,message,field,(int)int_value);
            field = (FieldDescriptor *)0x1;
          }
          else {
            if ((((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
                 (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) &&
                (lVar9 = (field->field_20).default_value_int64_t_,
                iVar16 = Reflection::GetEnumValue(reflection,message,field), lVar9 == iVar16)) &&
               ((field->field_20).default_value_int64_t_ == int_value)) {
              local_120.piece_._M_len = (size_t)message;
              local_120.piece_._M_str = (char *)field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::
              emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&value_9,
                         (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                          *)this->no_op_fields_,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)&local_120);
              goto LAB_003ac2b1;
            }
            bVar11 = true;
            Reflection::SetEnumValue(reflection,message,field,(int)int_value);
            field = (FieldDescriptor *)0x1;
          }
        }
      }
      else {
        bVar11 = FieldDescriptor::is_repeated(field);
        if (bVar11) {
          Reflection::AddEnum(reflection,message,field,value_00);
        }
        else {
          if ((this->no_op_fields_ != (UnsetFieldsMetadata *)0x0) &&
             (bVar11 = FieldDescriptor::has_presence(field), !bVar11)) {
            pEVar19 = FieldDescriptor::default_value_enum(field);
            pEVar20 = Reflection::GetEnum(reflection,message,field);
            if ((pEVar19 == pEVar20) &&
               (pEVar19 = FieldDescriptor::default_value_enum(field), pEVar19 == value_00)) {
              local_120.piece_._M_len = (size_t)message;
              local_120.piece_._M_str = (char *)field;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              ::
              emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                          *)&value_9,
                         (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                          *)this->no_op_fields_,
                         (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                          *)&local_120);
              goto LAB_003ac311;
            }
          }
          Reflection::SetEnum(reflection,message,field,value_00);
        }
LAB_003ac311:
        bVar11 = false;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value_9,"-",(allocator<char> *)&local_120);
      _Var12 = std::operator==(&(this->tokenizer_).current_.text,&value_9);
      if (_Var12) {
        std::__cxx11::string::~string((string *)&value_9);
LAB_003ac068:
        bVar11 = ConsumeSignedInteger(this,&int_value,0x7fffffff);
        if (bVar11) {
          absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&value_9,int_value);
          absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_120,(lts_20250127 *)&value_9,a);
          std::__cxx11::string::operator=((string *)&value_4,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          value_00 = EnumDescriptor::FindValueByNumber(this_00,(int)int_value);
          goto LAB_003ac0d6;
        }
      }
      else {
        TVar4 = (this->tokenizer_).current_.type;
        std::__cxx11::string::~string((string *)&value_9);
        if (TVar4 == TYPE_INTEGER) goto LAB_003ac068;
        value_9._0_16_ =
             absl::lts_20250127::NullSafeStringView("Expected integer or identifier, got: ");
        local_120.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
        local_120.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&value,(lts_20250127 *)&value_9,&local_120,
                   (AlphaNum *)local_120.piece_._M_len);
        message_01._M_str = (char *)value;
        message_01._M_len = (size_t)local_168;
        ReportError(this,message_01);
        psVar22 = (string *)&value;
LAB_003ac597:
        std::__cxx11::string::~string((string *)psVar22);
      }
LAB_003ac59c:
      bVar11 = true;
      field = (FieldDescriptor *)0x0;
    }
    bVar21 = (byte)field;
    std::__cxx11::string::~string((string *)&value_4);
    if (bVar11) goto LAB_003ac887;
    break;
  case 9:
    paVar1 = &value_9.field_2;
    value_9._M_string_length = 0;
    value_9._M_dataplus._M_p = (pointer)paVar1;
    value_9.field_2._M_local_buf[0] = '\0';
    bVar11 = ConsumeString(this,&value_9);
    if (!bVar11) {
      psVar22 = &value_9;
LAB_003ac880:
      std::__cxx11::string::~string((string *)psVar22);
      goto LAB_003ac885;
    }
    bVar11 = FieldDescriptor::is_repeated(field);
    if (bVar11) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_9._M_dataplus._M_p == paVar1) {
        local_b0.field_2._8_8_ = value_9.field_2._8_8_;
      }
      else {
        local_b0._M_dataplus._M_p = value_9._M_dataplus._M_p;
      }
      local_b0.field_2._M_allocated_capacity._1_7_ = value_9.field_2._M_allocated_capacity._1_7_;
      local_b0.field_2._M_local_buf[0] = value_9.field_2._M_local_buf[0];
      local_b0._M_string_length = value_9._M_string_length;
      value_9._M_string_length = 0;
      value_9._M_dataplus._M_p = (pointer)paVar1;
      value_9.field_2._M_local_buf[0] = '\0';
      Reflection::AddString(reflection,message,field,&local_b0);
      psVar22 = &local_b0;
LAB_003ac65b:
      std::__cxx11::string::~string((string *)psVar22);
    }
    else {
      if ((this->no_op_fields_ == (UnsetFieldsMetadata *)0x0) ||
         (bVar11 = FieldDescriptor::has_presence(field), bVar11)) {
LAB_003ac5ef:
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value_9._M_dataplus._M_p == paVar1) {
          local_d0.field_2._8_8_ = value_9.field_2._8_8_;
        }
        else {
          local_d0._M_dataplus._M_p = value_9._M_dataplus._M_p;
        }
        local_d0.field_2._M_allocated_capacity._1_7_ = value_9.field_2._M_allocated_capacity._1_7_;
        local_d0.field_2._M_local_buf[0] = value_9.field_2._M_local_buf[0];
        local_d0._M_string_length = value_9._M_string_length;
        value_9._M_string_length = 0;
        value_9._M_dataplus._M_p = (pointer)paVar1;
        value_9.field_2._M_local_buf[0] = '\0';
        Reflection::SetString(reflection,message,field,&local_d0);
        psVar22 = &local_d0;
        goto LAB_003ac65b;
      }
      pcVar6 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
      sVar7 = ((field->field_20).default_value_string_)->_M_string_length;
      Reflection::GetString_abi_cxx11_((string *)&local_120,reflection,message,field);
      __x._M_str = pcVar6;
      __x._M_len = sVar7;
      __y._M_str = (char *)local_120.piece_._M_len;
      __y._M_len = (size_t)local_120.piece_._M_str;
      bVar11 = std::operator==(__x,__y);
      if (!bVar11) {
        std::__cxx11::string::~string((string *)&local_120);
        goto LAB_003ac5ef;
      }
      __x_00._M_str = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
      __x_00._M_len = ((field->field_20).default_value_string_)->_M_string_length;
      __y_00._M_str = value_9._M_dataplus._M_p;
      __y_00._M_len = value_9._M_string_length;
      bVar11 = std::operator==(__x_00,__y_00);
      std::__cxx11::string::~string((string *)&local_120);
      if (!bVar11) goto LAB_003ac5ef;
      local_168 = field;
      value = (int64_t)message;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::
      emplace<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
                  *)&local_120,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                  *)this->no_op_fields_,
                 (pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                  *)&value);
    }
    psVar22 = &value_9;
LAB_003ac665:
    std::__cxx11::string::~string((string *)psVar22);
    break;
  case 10:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&value_9,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x3aa);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&value_9,(char (*) [45])"Reached an unintended state: CPPTYPE_MESSAGE")
    ;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&value_9)
    ;
  }
  bVar21 = 1;
LAB_003ac887:
  return (bool)(bVar21 & 1);
}

Assistant:

bool ConsumeFieldValue(Message* message, const Reflection* reflection,
                         const FieldDescriptor* field) {
// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
// When checking for no-op operations, We verify that both the existing value in
// the message and the new value are the default. If the existing field value is
// not the default, setting it to the default should not be treated as a no-op.
// The pointer of this is kept in no_op_fields_ for bookkeeping.
#define SET_FIELD(CPPTYPE, CPPTYPELCASE, VALUE)                    \
  if (field->is_repeated()) {                                      \
    reflection->Add##CPPTYPE(message, field, VALUE);               \
  } else {                                                         \
    if (no_op_fields_ && !field->has_presence() &&                 \
        field->default_value_##CPPTYPELCASE() ==                   \
            reflection->Get##CPPTYPE(*message, field) &&           \
        field->default_value_##CPPTYPELCASE() == VALUE) {          \
      no_op_fields_->ids_.insert(                                  \
          UnsetFieldsMetadata::GetUnsetFieldId(*message, *field)); \
    } else {                                                       \
      reflection->Set##CPPTYPE(message, field, std::move(VALUE));  \
    }                                                              \
  }

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, int32, static_cast<int32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, uint32, static_cast<uint32_t>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64_t value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64_t value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, uint64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        std::string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, string, std::move(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64_t value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, bool, static_cast<bool>(value));
        } else {
          std::string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, bool, false);
          } else {
            ReportError(absl::StrCat("Invalid value for boolean field \"",
                                     field->name(), "\". Value: \"", value,
                                     "\"."));
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        std::string value;
        int64_t int_value = kint64max;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = nullptr;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = absl::StrCat(int_value);  // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError(absl::StrCat("Expected integer or identifier, got: ",
                                   tokenizer_.current().text));
          return false;
        }

        if (enum_value == nullptr) {
          if (int_value != kint64max &&
              !field->legacy_enum_field_treated_as_closed()) {
            SET_FIELD(EnumValue, int64, int_value);
            return true;
          } else if (!allow_unknown_enum_) {
            ReportError(absl::StrCat("Unknown enumeration value of \"", value,
                                     "\" for field \"", field->name(), "\"."));
            return false;
          } else {
            ReportWarning(absl::StrCat("Unknown enumeration value of \"", value,
                                       "\" for field \"", field->name(),
                                       "\"."));
            return true;
          }
        }

        SET_FIELD(Enum, enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        ABSL_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }